

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall DLevelScript::DLevelScript(DLevelScript *this)

{
  DACSThinker *pDVar1;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f12c0;
  (this->Localvars).Array = (int *)0x0;
  (this->Localvars).Most = 0;
  (this->Localvars).Count = 0;
  this->next = (DLevelScript *)0x0;
  this->prev = (DLevelScript *)0x0;
  pDVar1 = GC::ReadBarrier<DACSThinker>((DACSThinker **)&DACSThinker::ActiveThinker);
  if (pDVar1 == (DACSThinker *)0x0) {
    pDVar1 = (DACSThinker *)DObject::operator_new(0x60);
    DACSThinker::DACSThinker(pDVar1);
  }
  this->activefont = SmallFont;
  return;
}

Assistant:

DLevelScript::DLevelScript ()
{
	next = prev = NULL;
	if (DACSThinker::ActiveThinker == NULL)
		new DACSThinker;
	activefont = SmallFont;
}